

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::GlobalUngroupedAggregateState::Combine
          (GlobalUngroupedAggregateState *this,LocalUngroupedAggregateState *other)

{
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_00;
  const_reference this_01;
  pointer this_02;
  BoundAggregateExpression *pBVar1;
  reference pvVar2;
  ulong __n;
  AggregateInputData aggr_input_data;
  Vector dest_state;
  Vector source_state;
  
  ::std::mutex::lock(&this->lock);
  for (__n = 0; this_00 = (this->state).aggregate_expressions,
      __n < (ulong)((long)(this_00->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this_00->
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ).
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
    this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>(this_00,__n);
    this_02 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_01);
    pBVar1 = BaseExpression::Cast<duckdb::BoundAggregateExpression>(&this_02->super_BaseExpression);
    if (pBVar1->aggr_type != DISTINCT) {
      pvVar2 = vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_true>
               ::get<true>(&(other->state).aggregate_data,__n);
      Value::POINTER((Value *)&dest_state,
                     (uintptr_t)
                     (pvVar2->
                     super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      Vector::Vector(&source_state,(Value *)&dest_state);
      Value::~Value((Value *)&dest_state);
      pvVar2 = vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_true>
               ::get<true>(&(this->state).aggregate_data,__n);
      Value::POINTER((Value *)&aggr_input_data,
                     (uintptr_t)
                     (pvVar2->
                     super_unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)._M_t.
                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      Vector::Vector(&dest_state,(Value *)&aggr_input_data);
      Value::~Value((Value *)&aggr_input_data);
      aggr_input_data.bind_data.ptr =
           (pBVar1->bind_info).
           super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      aggr_input_data.combine_type = ALLOW_DESTRUCTIVE;
      aggr_input_data.allocator = &this->allocator;
      (*(pBVar1->function).combine)(&source_state,&dest_state,&aggr_input_data,1);
      Vector::~Vector(&dest_state);
      Vector::~Vector(&source_state);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void GlobalUngroupedAggregateState::Combine(LocalUngroupedAggregateState &other) {
	lock_guard<mutex> glock(lock);
	for (idx_t aggr_idx = 0; aggr_idx < state.aggregate_expressions.size(); aggr_idx++) {
		auto &aggregate = state.aggregate_expressions[aggr_idx]->Cast<BoundAggregateExpression>();

		if (aggregate.IsDistinct()) {
			continue;
		}

		Vector source_state(Value::POINTER(CastPointerToValue(other.state.aggregate_data[aggr_idx].get())));
		Vector dest_state(Value::POINTER(CastPointerToValue(state.aggregate_data[aggr_idx].get())));

		AggregateInputData aggr_input_data(aggregate.bind_info.get(), allocator,
		                                   AggregateCombineType::ALLOW_DESTRUCTIVE);
		aggregate.function.combine(source_state, dest_state, aggr_input_data, 1);
#ifdef DEBUG
		state.counts[aggr_idx] += other.state.counts[aggr_idx];
#endif
	}
}